

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O3

void __thiscall
NshCmdArrayRegister_SuccessMaxElements_Test::~NshCmdArrayRegister_SuccessMaxElements_Test
          (NshCmdArrayRegister_SuccessMaxElements_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshCmdArrayRegister, SuccessMaxElements)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    for (auto i = 0u; i < NSH_CMD_MAX_COUNT; i++) {
        ASSERT_EQ(nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);
        ASSERT_EQ(cmds.count, i + 1);
        ASSERT_STREQ(cmds.array[i].name, cmd_test_name);
        ASSERT_EQ(cmds.array[i].handler, &cmd_test_handler);
    }
}